

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_movingcamera.cpp
# Opt level: O0

void __thiscall APathFollower::Serialize(APathFollower *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  FSerializer *arc_local;
  APathFollower *this_local;
  
  AActor::Serialize(&this->super_AActor,arc);
  pFVar1 = FSerializer::operator()(arc,"active",(bool *)&(this->super_AActor).field_0x4bc);
  pFVar1 = FSerializer::operator()(pFVar1,"juststepped",(bool *)&(this->super_AActor).field_0x4bd);
  pFVar1 = FSerializer::operator()(pFVar1,"prevnode",&this->PrevNode);
  pFVar1 = FSerializer::operator()(pFVar1,"currnode",&this->CurrNode);
  pFVar1 = FSerializer::operator()(pFVar1,"time",&this->Time);
  FSerializer::operator()(pFVar1,"holdtime",&this->HoldTime);
  return;
}

Assistant:

void APathFollower::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	arc("active", bActive)
		("juststepped", bJustStepped)
		("prevnode", PrevNode)
		("currnode", CurrNode)
		("time", Time)
		("holdtime", HoldTime);
}